

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.cpp
# Opt level: O2

string * __thiscall
mnf::Manifold::description
          (string *__return_storage_ptr__,Manifold *this,string *prefix,bool param_2)

{
  ostream *poVar1;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,(string *)prefix);
  poVar1 = std::operator<<(poVar1,(string *)&this->name_);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string Manifold::description(const std::string& prefix, bool) const
{
  std::stringstream ss;
  ss << prefix << name() << std::endl;
  return ss.str();
}